

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O3

FT_Error raccess_guess_linux_double
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  FT_Memory memory;
  FT_Error FVar1;
  char *file_name;
  
  memory = library->memory;
  file_name = raccess_make_file_name(memory,base_file_name,"%");
  if (file_name == (char *)0x0) {
    FVar1 = 0x40;
  }
  else {
    FVar1 = raccess_guess_linux_double_from_file_name(library,file_name,result_offset);
    if (FVar1 == 0) {
      *result_file_name = file_name;
      FVar1 = 0;
    }
    else {
      (*memory->free)(memory,file_name);
    }
  }
  return FVar1;
}

Assistant:

static FT_Error
  raccess_guess_linux_double( FT_Library  library,
                              FT_Stream   stream,
                              char       *base_file_name,
                              char      **result_file_name,
                              FT_Long    *result_offset )
  {
    char*      newpath;
    FT_Error   error;
    FT_Memory  memory;

    FT_UNUSED( stream );


    memory = library->memory;

    newpath = raccess_make_file_name( memory, base_file_name, "%" );
    if ( !newpath )
      return FT_THROW( Out_Of_Memory );

    error = raccess_guess_linux_double_from_file_name( library, newpath,
                                                       result_offset );
    if ( !error )
      *result_file_name = newpath;
    else
      FT_FREE( newpath );

    return error;
  }